

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O0

void Assimp::StandardShapes::MakeCircle
               (ai_real radius,uint tess,
               vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions)

{
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar1;
  size_type sVar2;
  double dVar3;
  aiVector3t<float> local_50;
  aiVector3t<float> local_44;
  aiVector3t<float> local_38;
  float local_2c;
  float local_28;
  ai_real angle;
  ai_real t;
  ai_real s;
  ai_real angle_max;
  ai_real angle_delta;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions_local;
  uint tess_local;
  ai_real radius_local;
  
  if ((2 < tess) && ((radius != 0.0 || (NAN(radius))))) {
    _angle_max = positions;
    positions_local._0_4_ = tess;
    positions_local._4_4_ = radius;
    dVar3 = std::fabs((double)(ulong)(uint)radius);
    pvVar1 = _angle_max;
    positions_local._4_4_ = SUB84(dVar3,0);
    sVar2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(_angle_max);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (pvVar1,sVar2 + (uint)positions_local * 3);
    s = 6.2831855 / (float)(uint)positions_local;
    t = 6.2831855;
    angle = 1.0;
    local_28 = 0.0;
    local_2c = 0.0;
    while (pvVar1 = _angle_max, local_2c < 6.2831855) {
      aiVector3t<float>::aiVector3t
                (&local_38,angle * positions_local._4_4_,0.0,local_28 * positions_local._4_4_);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (pvVar1,&local_38);
      local_2c = s + local_2c;
      dVar3 = std::cos((double)(ulong)(uint)local_2c);
      angle = SUB84(dVar3,0);
      dVar3 = std::sin((double)(ulong)(uint)local_2c);
      pvVar1 = _angle_max;
      local_28 = SUB84(dVar3,0);
      aiVector3t<float>::aiVector3t
                (&local_44,angle * positions_local._4_4_,0.0,local_28 * positions_local._4_4_);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (pvVar1,&local_44);
      pvVar1 = _angle_max;
      aiVector3t<float>::aiVector3t(&local_50,0.0,0.0,0.0);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (pvVar1,&local_50);
    }
  }
  return;
}

Assistant:

void StandardShapes::MakeCircle(ai_real radius, unsigned int tess,
    std::vector<aiVector3D>& positions)
{
    // Sorry, a circle with less than 3 segments makes ABSOLUTELY NO SENSE
    if (tess < 3 || !radius)
        return;

    radius = std::fabs(radius);

    // We will need 3 vertices per segment
    positions.reserve(positions.size()+tess*3);

    const ai_real angle_delta = (ai_real)AI_MATH_TWO_PI / tess;
    const ai_real angle_max   = (ai_real)AI_MATH_TWO_PI;

    ai_real s = 1.0; // std::cos(angle == 0);
    ai_real t = 0.0; // std::sin(angle == 0);

    for (ai_real angle = 0.0; angle < angle_max;  )
    {
        positions.push_back(aiVector3D(s * radius,0.0,t * radius));
        angle += angle_delta;
        s = std::cos(angle);
        t = std::sin(angle);
        positions.push_back(aiVector3D(s * radius,0.0,t * radius));

        positions.push_back(aiVector3D(0.0,0.0,0.0));
    }
}